

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read.c
# Opt level: O0

int choose_filters(archive_read *a)

{
  int iVar1;
  long lStack_50;
  int r;
  ssize_t avail;
  archive_read_filter *filter;
  archive_read_filter_bidder *best_bidder;
  archive_read_filter_bidder *bidder;
  int local_28;
  int number_filters;
  int best_bid;
  int bid;
  int i;
  int number_bidders;
  archive_read *a_local;
  
  bidder._4_4_ = 0;
  _i = a;
  while( true ) {
    if (0x18 < bidder._4_4_) {
      archive_set_error(&_i->archive,0x54,"Input requires too many filters for decoding");
      return -0x1e;
    }
    bid = 0x10;
    local_28 = 0;
    filter = (archive_read_filter *)0x0;
    best_bidder = _i->bidders;
    for (best_bid = 0; best_bid < bid; best_bid = best_bid + 1) {
      if ((best_bidder->vtable != (archive_read_filter_bidder_vtable *)0x0) &&
         (number_filters = (*best_bidder->vtable->bid)(best_bidder,_i->filter),
         local_28 < number_filters)) {
        filter = (archive_read_filter *)best_bidder;
        local_28 = number_filters;
      }
      best_bidder = best_bidder + 1;
    }
    if (filter == (archive_read_filter *)0x0) {
      __archive_read_filter_ahead(_i->filter,1,&stack0xffffffffffffffb0);
      if (lStack_50 < 0) {
        __archive_read_free_filters(_i);
        return -0x1e;
      }
      return 0;
    }
    avail = (ssize_t)calloc(1,0x90);
    if ((archive_read_filter *)avail == (archive_read_filter *)0x0) {
      return -0x1e;
    }
    ((archive_read_filter *)avail)->bidder = (archive_read_filter_bidder *)filter;
    ((archive_read_filter *)avail)->archive = _i;
    ((archive_read_filter *)avail)->upstream = _i->filter;
    _i->filter = (archive_read_filter *)avail;
    iVar1 = (*(code *)filter->upstream->bidder)(_i->filter);
    if (iVar1 != 0) break;
    bidder._4_4_ = bidder._4_4_ + 1;
  }
  __archive_read_free_filters(_i);
  return -0x1e;
}

Assistant:

static int
choose_filters(struct archive_read *a)
{
	int number_bidders, i, bid, best_bid, number_filters;
	struct archive_read_filter_bidder *bidder, *best_bidder;
	struct archive_read_filter *filter;
	ssize_t avail;
	int r;

	for (number_filters = 0; number_filters < MAX_NUMBER_FILTERS; ++number_filters) {
		number_bidders = sizeof(a->bidders) / sizeof(a->bidders[0]);

		best_bid = 0;
		best_bidder = NULL;

		bidder = a->bidders;
		for (i = 0; i < number_bidders; i++, bidder++) {
			if (bidder->vtable == NULL)
				continue;
			bid = (bidder->vtable->bid)(bidder, a->filter);
			if (bid > best_bid) {
				best_bid = bid;
				best_bidder = bidder;
			}
		}

		/* If no bidder, we're done. */
		if (best_bidder == NULL) {
			/* Verify the filter by asking it for some data. */
			__archive_read_filter_ahead(a->filter, 1, &avail);
			if (avail < 0) {
				__archive_read_free_filters(a);
				return (ARCHIVE_FATAL);
			}
			return (ARCHIVE_OK);
		}

		filter
		    = (struct archive_read_filter *)calloc(1, sizeof(*filter));
		if (filter == NULL)
			return (ARCHIVE_FATAL);
		filter->bidder = best_bidder;
		filter->archive = a;
		filter->upstream = a->filter;
		a->filter = filter;
		r = (best_bidder->vtable->init)(a->filter);
		if (r != ARCHIVE_OK) {
			__archive_read_free_filters(a);
			return (ARCHIVE_FATAL);
		}
	}
	archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
	    "Input requires too many filters for decoding");
	return (ARCHIVE_FATAL);
}